

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_MultipleMemTables::_Run(_Test_MultipleMemTables *this)

{
  RecoveryTest *pRVar1;
  Tester *pTVar2;
  uint uVar3;
  int iVar4;
  allocator local_2e9;
  RecoveryTest *local_2e8;
  uint64_t old_log_file;
  string local_2d8;
  char buf [100];
  undefined1 local_250 [448];
  Options opt;
  
  pTVar2 = (Tester *)(local_250 + 0x20);
  uVar3 = 0;
  local_2e8 = &this->super_RecoveryTest;
  for (; uVar3 != 1000; uVar3 = uVar3 + 1) {
    snprintf(buf,100,"%050d",(ulong)uVar3);
    test::Tester::Tester
              (pTVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
               ,0xfa);
    std::__cxx11::string::string((string *)&opt,buf,(allocator *)&old_log_file);
    std::__cxx11::string::string((string *)&local_2d8,buf,&local_2e9);
    RecoveryTest::Put((RecoveryTest *)local_250,&local_2e8->dbname_,(string *)&opt);
    test::Tester::IsOk(pTVar2,(Status *)local_250);
    Status::~Status((Status *)local_250);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&opt);
    test::Tester::~Tester(pTVar2);
  }
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xfc);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  opt.comparator._0_4_ = RecoveryTest::NumTables(local_2e8);
  test::Tester::IsEq<int,int>((Tester *)(local_250 + 0x20),(int *)buf,(int *)&opt);
  test::Tester::~Tester((Tester *)(local_250 + 0x20));
  pRVar1 = local_2e8;
  RecoveryTest::Close(local_2e8);
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xfe);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  opt.comparator._0_4_ = RecoveryTest::NumTables(pRVar1);
  test::Tester::IsEq<int,int>((Tester *)(local_250 + 0x20),(int *)buf,(int *)&opt);
  test::Tester::~Tester((Tester *)(local_250 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xff);
  buf[0] = '\x01';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  opt.comparator._0_4_ = RecoveryTest::NumLogs(local_2e8);
  test::Tester::IsEq<int,int>((Tester *)(local_250 + 0x20),(int *)buf,(int *)&opt);
  test::Tester::~Tester((Tester *)(local_250 + 0x20));
  pRVar1 = local_2e8;
  old_log_file = RecoveryTest::FirstLogFile(local_2e8);
  Options::Options(&opt);
  opt.reuse_logs = true;
  opt.write_buffer_size = 50000;
  RecoveryTest::Open(pRVar1,&opt);
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x107);
  buf[0] = '\x02';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  local_2d8._M_dataplus._M_p._0_4_ = RecoveryTest::NumTables(pRVar1);
  test::Tester::IsLe<int,int>((Tester *)(local_250 + 0x20),(int *)buf,(int *)&local_2d8);
  test::Tester::~Tester((Tester *)(local_250 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x108);
  buf[0] = '\x01';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  local_2d8._M_dataplus._M_p._0_4_ = RecoveryTest::NumLogs(local_2e8);
  test::Tester::IsEq<int,int>((Tester *)(local_250 + 0x20),(int *)buf,(int *)&local_2d8);
  test::Tester::~Tester((Tester *)(local_250 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_250 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x109);
  buf._0_8_ = RecoveryTest::FirstLogFile(local_2e8);
  pTVar2 = test::Tester::IsNe<unsigned_long,unsigned_long>
                     ((Tester *)(local_250 + 0x20),&old_log_file,(unsigned_long *)buf);
  test::Tester::operator<<(pTVar2,(char (*) [19])"must not reuse log");
  pTVar2 = (Tester *)(local_250 + 0x20);
  test::Tester::~Tester(pTVar2);
  for (iVar4 = 0; iVar4 != 1000; iVar4 = iVar4 + 1) {
    snprintf(buf,100,"%050d");
    test::Tester::Tester
              (pTVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
               ,0x10d);
    std::__cxx11::string::string((string *)local_250,buf,&local_2e9);
    RecoveryTest::Get(&local_2d8,local_2e8,(string *)local_250,(Snapshot *)0x0);
    test::Tester::IsEq<char[100],std::__cxx11::string>(pTVar2,&buf,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)local_250);
    test::Tester::~Tester(pTVar2);
  }
  return;
}

Assistant:

TEST(RecoveryTest, MultipleMemTables) {
  // Make a large log.
  const int kNum = 1000;
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_OK(Put(buf, buf));
  }
  ASSERT_EQ(0, NumTables());
  Close();
  ASSERT_EQ(0, NumTables());
  ASSERT_EQ(1, NumLogs());
  uint64_t old_log_file = FirstLogFile();

  // Force creation of multiple memtables by reducing the write buffer size.
  Options opt;
  opt.reuse_logs = true;
  opt.write_buffer_size = (kNum * 100) / 2;
  Open(&opt);
  ASSERT_LE(2, NumTables());
  ASSERT_EQ(1, NumLogs());
  ASSERT_NE(old_log_file, FirstLogFile()) << "must not reuse log";
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_EQ(buf, Get(buf));
  }
}